

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

bool __thiscall
chaiscript::detail::Dispatch_Function::operator==(Dispatch_Function *this,Proxy_Function_Base *rhs)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  pointer psVar4;
  long *plVar5;
  bool bVar6;
  
  lVar3 = __dynamic_cast(rhs,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,&typeinfo,0);
  if (lVar3 == 0) {
    __cxa_bad_cast();
  }
  psVar1 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  plVar5 = *(long **)(lVar3 + 0x28);
  if ((long)psVar2 - (long)psVar1 == *(long *)(lVar3 + 0x30) - (long)plVar5) {
    if (psVar1 == psVar2) {
      bVar6 = true;
    }
    else {
      do {
        psVar4 = psVar1 + 1;
        bVar6 = (psVar1->
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr == (element_type *)*plVar5;
        if (!bVar6) {
          return bVar6;
        }
        plVar5 = plVar5 + 2;
        psVar1 = psVar4;
      } while (psVar4 != psVar2);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

virtual bool operator==(const dispatch::Proxy_Function_Base &rhs) const CHAISCRIPT_OVERRIDE
        {
          try {
            const auto &dispatch_fun = dynamic_cast<const Dispatch_Function &>(rhs);
            return m_funcs == dispatch_fun.m_funcs;
          } catch (const std::bad_cast &) {
            return false;
          }
        }